

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::statement(Parser *this)

{
  token_type tVar1;
  Node *pNVar2;
  
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 == LBRACE) {
    pNVar2 = compound_statement(this);
    return pNVar2;
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 == LET) {
    pNVar2 = declaration(this);
    return pNVar2;
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 == IDENTIFIER) {
    pNVar2 = set(this);
    return pNVar2;
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 == IF) {
    pNVar2 = selection_statement(this);
    return pNVar2;
  }
  tVar1 = Lexer::current_token_type(this->lex);
  if (tVar1 == FOR) {
    pNVar2 = cycle_for(this);
    return pNVar2;
  }
  Lexer::current_token_type(this->lex);
  pNVar2 = println(this);
  return pNVar2;
}

Assistant:

Node* Parser::statement()
{
	if (tryEat(token_type::LBRACE)) {
		Node* compound_node = compound_statement();
		return compound_node;
	}
	else if (tryEat(token_type::LET)) {
		Node* declaration_node = declaration();
		return declaration_node;
	}
	else if (tryEat(token_type::IDENTIFIER)) {
		Node* assign_node = set();
		return assign_node;
	}
	else if (tryEat(token_type::IF)) {
		Node* selection_node = selection_statement();
		return selection_node;
	}
	else if (tryEat(token_type::FOR)) {
		Node* cycle_for_node = cycle_for();
		return cycle_for_node;
	}
	else if (tryEat(token_type::PRINTLN)) {
		Node* println_node = println();
		return println_node;
	}
}